

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::BuildAlias
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *alias,string *param_2
          )

{
  string *param_2_local;
  string *alias_local;
  cmGlobalNinjaGenerator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)alias);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string BuildAlias(const std::string& alias,
                                 const std::string& /*config*/) const
  {
    return alias;
  }